

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cli::Parser::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parser *this,string *name)

{
  pointer ppCVar1;
  size_t __n;
  int iVar2;
  runtime_error *prVar3;
  long *plVar4;
  long *plVar5;
  CmdBase *pCVar6;
  pointer ppCVar7;
  bool bVar8;
  bool bVar9;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppCVar7 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar8 = ppCVar7 == ppCVar1;
  if (!bVar8) {
    local_58 = &__return_storage_ptr__->field_2;
    do {
      pCVar6 = *ppCVar7;
      __n = (pCVar6->name)._M_string_length;
      if (__n == name->_M_string_length) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp((pCVar6->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        if ((pCVar6 == (CmdBase *)0x0) ||
           (pCVar6->_vptr_CmdBase != (_func_int **)&PTR__CmdArgument_00127860)) {
          pCVar6 = (CmdBase *)0x0;
        }
        if (pCVar6 == (CmdBase *)0x0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"Invalid usage of the parameter ",name);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_78 = (long *)*plVar4;
          plVar5 = plVar4 + 2;
          if (local_78 == plVar5) {
            local_68 = *plVar5;
            lStack_60 = plVar4[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *plVar5;
          }
          local_70 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::runtime_error::runtime_error(prVar3,(string *)&local_78);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pCVar6[1]._vptr_CmdBase,
                   pCVar6[1].name._M_dataplus._M_p + (long)pCVar6[1]._vptr_CmdBase);
        if (bVar9) {
          if (!bVar8) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
      ppCVar7 = ppCVar7 + 1;
      bVar8 = ppCVar7 == ppCVar1;
    } while (!bVar8);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"The parameter ",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_78 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar5;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_78);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}